

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void obj1undo(mcmcxdef *mctx,objucxdef *undoctx)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uchar *puVar5;
  mcmcxdef *ctx;
  long in_RSI;
  int in_stack_00000008;
  prpnum in_stack_0000000c;
  objnum in_stack_0000000e;
  mcmcxdef *in_stack_00000010;
  int indexed;
  objdef *objptr;
  ushort pofs;
  ushort prv;
  uchar pr [6];
  uchar cmd;
  objnum objn;
  prpnum prop;
  uchar *p;
  objucxdef *in_stack_00000178;
  void *in_stack_00000180;
  dattyp in_stack_00000188;
  prpnum in_stack_0000018c;
  objnum in_stack_0000018e;
  mcmcxdef *in_stack_00000190;
  char *in_stack_ffffffffffffffb8;
  mcmon obj;
  errcxdef *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  byte *local_18;
  
  if (*(short *)(in_RSI + 0x16) == *(short *)(in_RSI + 0x12)) {
    errsigf(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  }
  *(undefined2 *)(in_RSI + 0x12) = *(undefined2 *)(in_RSI + 0x16);
  pbVar4 = (byte *)(in_RSI + 0x38 + (ulong)*(ushort *)(in_RSI + 0x16));
  bVar1 = *pbVar4;
  local_18 = pbVar4 + 3;
  if (*(short *)(in_RSI + 0x16) == *(short *)(in_RSI + 0x14)) {
    *(undefined2 *)(in_RSI + 0x16) = *(undefined2 *)(in_RSI + 0x12);
  }
  else {
    *(undefined2 *)(in_RSI + 0x16) = *(undefined2 *)(pbVar4 + 1);
  }
  if (bVar1 != 3) {
    if (bVar1 != 5) {
      local_18 = pbVar4 + 7;
      puVar5 = mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (mcmon)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
      obj = (mcmon)((ulong)in_stack_ffffffffffffffb8 >> 0x30);
      uVar2 = osrp2(puVar5 + 2);
      in_stack_ffffffffffffffcc = uVar2 & 2;
      mcmunlck((mcmcxdef *)in_stack_ffffffffffffffc0,obj);
    }
    ctx = (mcmcxdef *)(ulong)(bVar1 - 1);
    switch(ctx) {
    case (mcmcxdef *)0x0:
      objdelp(in_stack_00000010,in_stack_0000000e,in_stack_0000000c,in_stack_00000008);
      if (in_stack_ffffffffffffffcc != 0) {
        objindx(mctx,undoctx._6_2_);
      }
      break;
    case (mcmcxdef *)0x1:
      objsetp(in_stack_00000190,in_stack_0000018e,in_stack_0000018c,in_stack_00000188,
              in_stack_00000180,in_stack_00000178);
      break;
    case (mcmcxdef *)0x3:
      objdelp(in_stack_00000010,in_stack_0000000e,in_stack_0000000c,in_stack_00000008);
      uVar3 = objgetp(mctx,undoctx._6_2_,undoctx._4_2_,(dattyp *)p);
      puVar5 = mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (mcmon)((ulong)ctx >> 0x30));
      if ((short)uVar3 == 0) {
        puVar5 = (uchar *)0x0;
      }
      else {
        puVar5 = puVar5 + (int)(uVar3 & 0xffff);
      }
      puVar5[5] = puVar5[5] & 0xfd;
      mcmunlck(ctx,(mcmon)((ulong)puVar5 >> 0x30));
      break;
    case (mcmcxdef *)0x4:
      (**(code **)(in_RSI + 0x20))(*(undefined8 *)(in_RSI + 0x30),local_18);
    }
  }
  return;
}

Assistant:

void obj1undo(mcmcxdef *mctx, objucxdef *undoctx)
{
    uchar  *p;
    prpnum  prop;
    objnum  objn;
    uchar   cmd;
    uchar   pr[PRPHDRSIZ];                     /* space for property header */
    ushort  prv;
    ushort  pofs;
    objdef *objptr;
    int     indexed;

    /* if there's no more undo, signal an error */
    if (undoctx->objucxprv == undoctx->objucxhead)
        errsig(undoctx->objucxerr, ERR_NOUNDO);
    
    /* move back to previous record */
    undoctx->objucxhead = undoctx->objucxprv;
    p = &undoctx->objucxbuf[undoctx->objucxprv];
    
    /* get command, and set undocxprv to previous record */
    cmd = *p++;
    memcpy(&prv, p, sizeof(prv));
    p += sizeof(prv);
    
    /* if we're at the tail, no more undo; otherwise, use back link */
    if (undoctx->objucxprv == undoctx->objucxtail)
        undoctx->objucxprv = undoctx->objucxhead;
    else
        undoctx->objucxprv = prv;
    
    if (cmd == OBJUSAV) return;       /* savepointer marker - nothing to do */
    
    /* get object/property information for property-changing undo */
    if (cmd != OBJUCLI)
    {
        memcpy(&objn, p, (size_t)sizeof(objn));
        p += sizeof(objn);
        memcpy(&prop, p, (size_t)sizeof(prop));
        p += sizeof(prop);
        objptr = mcmlck(mctx, objn);
        indexed = (objflg(objptr) & OBJFINDEX);
        mcmunlck(mctx, objn);
    }
    
    switch(cmd)
    {
    case OBJUADD:
        objdelp(mctx, objn, prop, FALSE);
        if (indexed) objindx(mctx, objn);
        break;
        
    case OBJUOVR:
        objdelp(mctx, objn, prop, FALSE);  /* delete the non-original value */
        pofs = objgetp(mctx, objn, prop, (dattyp *)0);  /* get ignored prop */
        objptr = (objdef *)mcmlck(mctx, objn);           /* lock the object */
        prpflg(objofsp(objptr, pofs)) &= ~PRPFIGN;     /* no longer ignored */
        mcmunlck(mctx, objn);                          /* unlock the object */
        break;
        
    case OBJUCHG:
        memcpy(pr, p, (size_t)PRPHDRSIZ);
        p += PRPHDRSIZ;
        objsetp(mctx, objn, prop, prptype(pr), (void *)p, (objucxdef *)0);
        break;
        
    case OBJUCLI:
        (*undoctx->objucxcun)(undoctx->objucxccx, p);
        break;
    }
}